

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

int cPow(int x,int n)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 0;
  if (0 < n) {
    iVar2 = n;
  }
  iVar1 = 1;
  while( true ) {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) break;
    iVar1 = iVar1 * x;
  }
  return iVar1;
}

Assistant:

procedure 
int cPow(int x, int n) {
	variable int i; variable int r;
	r = 1; i = 0;
	while (i < n) {
		r = r * x;
		i = i + 1;
	}
	return r;
}